

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::PromisedAsyncIoStream::pumpTo
          (PromisedAsyncIoStream *this,AsyncOutputStream *output,uint64_t amount)

{
  _func_int **pp_Var1;
  PromiseArena *pPVar2;
  undefined8 uVar3;
  void *pvVar4;
  PromiseArena *in_RCX;
  undefined1 local_60 [32];
  Event *local_40;
  Event **local_38;
  
  pp_Var1 = output[6]._vptr_AsyncOutputStream;
  if (pp_Var1 == (_func_int **)0x0) {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_60);
    uVar3 = local_60._0_8_;
    pPVar2 = ((PromiseArenaMember *)local_60._0_8_)->arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_60._0_8_ - (long)pPVar2) < 0x38) {
      pvVar4 = operator_new(0x400);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)((long)pvVar4 + 0x3c8),(OwnPromiseNode *)local_60,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2401:39)>
                 ::anon_class_24_3_31b3e6fc_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3c8) = &PTR_destroy_006e0a40;
      *(AsyncOutputStream **)((long)pvVar4 + 1000) = output;
      *(uint64_t *)((long)pvVar4 + 0x3f0) = amount;
      *(PromiseArena **)((long)pvVar4 + 0x3f8) = in_RCX;
      *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
      local_60._16_8_ = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3c8);
    }
    else {
      ((PromiseArenaMember *)local_60._0_8_)->arena = (PromiseArena *)0x0;
      local_60._8_8_ = &((PromiseArenaMember *)(local_60._0_8_ + -0x40))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_60._8_8_,(OwnPromiseNode *)local_60,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2401:39)>
                 ::anon_class_24_3_31b3e6fc_for_func::operator());
      ((PromiseArenaMember *)(uVar3 + -0x40))->arena = (PromiseArena *)&PTR_destroy_006e0a40;
      ((PromiseArenaMember *)(uVar3 + -0x20))->arena = (PromiseArena *)output;
      ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)amount;
      ((PromiseArenaMember *)(uVar3 + -0x10))->arena = in_RCX;
      ((PromiseArenaMember *)(uVar3 + -0x30))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
      local_60._16_8_ = local_60._8_8_;
    }
    local_60._24_8_ = &DAT_004ddfe0;
    local_40 = (Event *)&DAT_004de03f;
    local_38 = (Event **)0x4c0000058b;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)this,(OwnPromiseNode *)(local_60 + 0x10),
               (SourceLocation *)(local_60 + 0x18));
    uVar3 = local_60._16_8_;
    if ((TransformPromiseNodeBase *)local_60._16_8_ != (TransformPromiseNodeBase *)0x0) {
      local_60._16_8_ = (TransformPromiseNodeBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    }
    uVar3 = local_60._0_8_;
    if ((PromiseArenaMember *)local_60._0_8_ != (PromiseArenaMember *)0x0) {
      local_60._0_8_ = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    }
  }
  else {
    (**(code **)(*pp_Var1 + 0x18))(this,pp_Var1,amount);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
    KJ_IF_SOME(s, stream) {
      return s->pumpTo(output, amount);
    } else {
      return promise.addBranch().then([this,&output,amount]() {
        return KJ_ASSERT_NONNULL(stream)->pumpTo(output, amount);
      });
    }
  }